

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlobIOSystem.h
# Opt level: O0

void __thiscall Assimp::BlobIOSystem::~BlobIOSystem(BlobIOSystem *this)

{
  aiExportDataBlob *this_00;
  bool bVar1;
  reference ppVar2;
  BlobEntry *blobby;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiExportDataBlob_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiExportDataBlob_*>_>_>
  *__range2;
  BlobIOSystem *this_local;
  
  (this->super_IOSystem)._vptr_IOSystem = (_func_int **)&PTR__BlobIOSystem_01040bf8;
  __end2 = std::
           vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiExportDataBlob_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiExportDataBlob_*>_>_>
           ::begin(&this->blobs);
  blobby = (BlobEntry *)
           std::
           vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiExportDataBlob_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiExportDataBlob_*>_>_>
           ::end(&this->blobs);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiExportDataBlob_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiExportDataBlob_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiExportDataBlob_*>_>_>_>
                                *)&blobby);
    if (!bVar1) break;
    ppVar2 = __gnu_cxx::
             __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiExportDataBlob_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiExportDataBlob_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiExportDataBlob_*>_>_>_>
             ::operator*(&__end2);
    this_00 = ppVar2->second;
    if (this_00 != (aiExportDataBlob *)0x0) {
      aiExportDataBlob::~aiExportDataBlob(this_00);
      operator_delete(this_00);
    }
    __gnu_cxx::
    __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiExportDataBlob_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiExportDataBlob_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiExportDataBlob_*>_>_>_>
    ::operator++(&__end2);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiExportDataBlob_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiExportDataBlob_*>_>_>
  ::~vector(&this->blobs);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set(&this->created);
  IOSystem::~IOSystem(&this->super_IOSystem);
  return;
}

Assistant:

virtual ~BlobIOSystem()
    {
        for(BlobEntry& blobby : blobs) {
            delete blobby.second;
        }
    }